

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

double __thiscall
ON_SurfaceCurvature::KappaValue(ON_SurfaceCurvature *this,curvature_style kappa_style)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  switch(kappa_style) {
  case gaussian_curvature:
    if ((ABS(this->k1) < 1.23432101234321e+308) && (ABS(this->k2) < 1.23432101234321e+308)) {
      return this->k1 * this->k2;
    }
    break;
  case mean_curvature:
    dVar2 = this->k1;
    dVar3 = ON_DBL_QNAN;
    if ((ABS(dVar2) < 1.23432101234321e+308) &&
       (dVar1 = this->k2, ABS(dVar1) < 1.23432101234321e+308)) {
      if ((dVar2 != dVar1) || (dVar3 = dVar2, NAN(dVar2) || NAN(dVar1))) {
        dVar3 = (dVar2 + dVar1) * 0.5;
      }
    }
    return ABS(dVar3);
  case min_curvature:
    dVar2 = MinimumRadius(this);
    return dVar2;
  case max_curvature:
    dVar2 = MaximumRadius(this);
    return dVar2;
  }
  return ON_DBL_QNAN;
}

Assistant:

double ON_SurfaceCurvature::KappaValue(ON::curvature_style kappa_style) const
{
  double k;
  switch (kappa_style)
  {
  case ON::gaussian_curvature:
    k = this->GaussianCurvature();
    break;

  case ON::mean_curvature:
    // fabs() is correct here.
    // Turns out the vast majority of users don't appear to care about 
    // signed mean curvature and find it confusing.
    k = fabs(this->MeanCurvature());
    break;

  case ON::min_curvature:
    k = this->MinimumRadius();
    break;

  case ON::max_curvature:
    k = this->MaximumRadius();
    break;

  default:
    k = ON_DBL_QNAN;
    break;
  }
  return k;
}